

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::detail::scope_exit::~scope_exit(scope_exit *this)

{
  scope_exit *this_local;
  
  if ((this->execute_on_destruction & 1U) != 0) {
    std::function<void_()>::operator()(&this->exit_function);
  }
  std::function<void_()>::~function(&this->exit_function);
  return;
}

Assistant:

~scope_exit() {
    if (execute_on_destruction) { this->exit_function(); }
  }